

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UChar32 ucnv_getNextUChar_63(UConverter *cnv,char **source,char *sourceLimit,UErrorCode *err)

{
  char *pcVar1;
  UBool UVar2;
  char cVar3;
  char cVar4;
  UChar32 UVar5;
  int iVar6;
  int32_t delta;
  UChar c2;
  uint16_t __c2;
  UChar *overflow;
  int local_80;
  int32_t length;
  int32_t i;
  UChar32 c;
  char *s;
  undefined1 local_68 [4];
  UChar buffer [2];
  UConverterToUnicodeArgs args;
  UErrorCode *err_local;
  char *sourceLimit_local;
  char **source_local;
  UConverter *cnv_local;
  
  if ((err == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*err), UVar2 != '\0')) {
    cnv_local._4_4_ = 0xffff;
  }
  else if ((cnv == (UConverter *)0x0) || (source == (char **)0x0)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    cnv_local._4_4_ = 0xffff;
  }
  else {
    pcVar1 = *source;
    if (sourceLimit < pcVar1) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      cnv_local._4_4_ = 0xffff;
    }
    else if (((ulong)((long)sourceLimit - (long)pcVar1) < 0x80000000) || (sourceLimit <= pcVar1)) {
      length = -1;
      if ('\0' < cnv->UCharErrorBufferLength) {
        cVar4 = cnv->UCharErrorBufferLength;
        local_80 = 1;
        length = (int32_t)(ushort)cnv->UCharErrorBuffer[0];
        iVar6 = 1;
        if ((((length & 0xfffffc00U) == 0xd800) && (cVar4 != 1)) &&
           (iVar6 = local_80, (cnv->UCharErrorBuffer[1] & 0xfc00U) == 0xdc00)) {
          length = length * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[1] + -0x35fdc00;
          iVar6 = 2;
        }
        local_80 = iVar6;
        cVar3 = cVar4 - (char)local_80;
        cnv->UCharErrorBufferLength = cVar3;
        if ('\0' < cVar3) {
          memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + local_80,
                  (long)((int)cnv->UCharErrorBufferLength << 1));
        }
        if (((length & 0xfffffc00U) != 0xd800) || (local_80 < cVar4)) {
          return length;
        }
      }
      local_68[2] = '\x01';
      args.sourceLimit = (char *)((long)&s + 4);
      local_68._0_2_ = 0x38;
      if (length < 0) {
        if ((cnv->toULength == '\0') &&
           (cnv->sharedData->impl->getNextUChar != (UConverterGetNextUChar)0x0)) {
          UVar5 = (*cnv->sharedData->impl->getNextUChar)((UConverterToUnicodeArgs *)local_68,err);
          *source = pcVar1;
          if (*err == U_INDEX_OUTOFBOUNDS_ERROR) {
            _reset(cnv,UCNV_RESET_TO_UNICODE,'\0');
            return 0xffff;
          }
          UVar2 = U_SUCCESS(*err);
          if ((UVar2 != '\0') && (-1 < UVar5)) {
            return UVar5;
          }
        }
        _toUnicodeWithCallback((UConverterToUnicodeArgs *)local_68,err);
        if (*err == U_BUFFER_OVERFLOW_ERROR) {
          *err = U_ZERO_ERROR;
        }
        overflow._4_4_ = (int)((long)args.sourceLimit - ((long)&s + 4) >> 1);
      }
      else {
        s._4_2_ = (ushort)length;
        args.sourceLimit = (char *)((long)&s + 6);
        overflow._4_4_ = 1;
      }
      local_80 = 0;
      UVar2 = U_FAILURE(*err);
      if (UVar2 == '\0') {
        if (overflow._4_4_ == 0) {
          *err = U_INDEX_OUTOFBOUNDS_ERROR;
          length = 0xffff;
        }
        else {
          length = (int32_t)s._4_2_;
          local_80 = 1;
          if ((length & 0xfffffc00U) == 0xd800) {
            if (cnv->UCharErrorBufferLength < '\x01') {
              if (pcVar1 < sourceLimit) {
                _toUnicodeWithCallback((UConverterToUnicodeArgs *)local_68,err);
                if (*err == U_BUFFER_OVERFLOW_ERROR) {
                  *err = U_ZERO_ERROR;
                }
                overflow._4_4_ = (int)((long)args.sourceLimit - ((long)&s + 4) >> 1);
                UVar2 = U_SUCCESS(*err);
                if (((UVar2 != '\0') && (overflow._4_4_ == 2)) && ((s._6_2_ & 0xfc00) == 0xdc00)) {
                  length = length * 0x400 + (uint)s._6_2_ + -0x35fdc00;
                  local_80 = 2;
                }
              }
            }
            else if ((cnv->UCharErrorBuffer[0] & 0xfc00U) == 0xdc00) {
              length = length * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[0] + -0x35fdc00;
              cVar4 = cnv->UCharErrorBufferLength + -1;
              cnv->UCharErrorBufferLength = cVar4;
              if ('\0' < cVar4) {
                memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + 1,
                        (long)((int)cnv->UCharErrorBufferLength << 1));
              }
            }
          }
        }
      }
      else {
        length = 0xffff;
      }
      if (local_80 < overflow._4_4_) {
        iVar6 = overflow._4_4_ - local_80;
        cVar4 = cnv->UCharErrorBufferLength;
        if (0 < cVar4) {
          memmove(cnv->UCharErrorBuffer + iVar6,cnv->UCharErrorBuffer,(long)((int)cVar4 << 1));
        }
        cnv->UCharErrorBufferLength = cVar4 + (char)iVar6;
        cnv->UCharErrorBuffer[0] = *(UChar *)((long)&s + (long)local_80 * 2 + 4);
        if (1 < iVar6) {
          cnv->UCharErrorBuffer[1] = *(UChar *)((long)&s + (long)(local_80 + 1) * 2 + 4);
        }
      }
      *source = pcVar1;
      cnv_local._4_4_ = length;
    }
    else {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      cnv_local._4_4_ = 0xffff;
    }
  }
  return cnv_local._4_4_;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucnv_getNextUChar(UConverter *cnv,
                  const char **source, const char *sourceLimit,
                  UErrorCode *err) {
    UConverterToUnicodeArgs args;
    UChar buffer[U16_MAX_LENGTH];
    const char *s;
    UChar32 c;
    int32_t i, length;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return 0xffff;
    }

    if(cnv==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    s=*source;
    if(sourceLimit<s) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    /*
     * Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be sourceLimit=t+0x7fffffff; for example.
     */
    if(((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s)) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    c=U_SENTINEL;

    /* flush the target overflow buffer */
    if(cnv->UCharErrorBufferLength>0) {
        UChar *overflow;

        overflow=cnv->UCharErrorBuffer;
        i=0;
        length=cnv->UCharErrorBufferLength;
        U16_NEXT(overflow, i, length, c);

        /* move the remaining overflow contents up to the beginning */
        if((cnv->UCharErrorBufferLength=(int8_t)(length-i))>0) {
            uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+i,
                         cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
        }

        if(!U16_IS_LEAD(c) || i<length) {
            return c;
        }
        /*
         * Continue if the overflow buffer contained only a lead surrogate,
         * in case the converter outputs single surrogates from complete
         * input sequences.
         */
    }

    /*
     * flush==TRUE is implied for ucnv_getNextUChar()
     *
     * do not simply return even if s==sourceLimit because the converter may
     * not have seen flush==TRUE before
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=TRUE;
    args.offsets=NULL;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=buffer;
    args.targetLimit=buffer+1;
    args.size=sizeof(args);

    if(c<0) {
        /*
         * call the native getNextUChar() implementation if we are
         * at a character boundary (toULength==0)
         *
         * unlike with _toUnicode(), getNextUChar() implementations must set
         * U_TRUNCATED_CHAR_FOUND for truncated input,
         * in addition to setting toULength/toUBytes[]
         */
        if(cnv->toULength==0 && cnv->sharedData->impl->getNextUChar!=NULL) {
            c=cnv->sharedData->impl->getNextUChar(&args, err);
            *source=s=args.source;
            if(*err==U_INDEX_OUTOFBOUNDS_ERROR) {
                /* reset the converter without calling the callback function */
                _reset(cnv, UCNV_RESET_TO_UNICODE, FALSE);
                return 0xffff; /* no output */
            } else if(U_SUCCESS(*err) && c>=0) {
                return c;
            /*
             * else fall through to use _toUnicode() because
             *   UCNV_GET_NEXT_UCHAR_USE_TO_U: the native function did not want to handle it after all
             *   U_FAILURE: call _toUnicode() for callback handling (do not output c)
             */
            }
        }

        /* convert to one UChar in buffer[0], or handle getNextUChar() errors */
        _toUnicodeWithCallback(&args, err);

        if(*err==U_BUFFER_OVERFLOW_ERROR) {
            *err=U_ZERO_ERROR;
        }

        i=0;
        length=(int32_t)(args.target-buffer);
    } else {
        /* write the lead surrogate from the overflow buffer */
        buffer[0]=(UChar)c;
        args.target=buffer+1;
        i=0;
        length=1;
    }

    /* buffer contents starts at i and ends before length */

    if(U_FAILURE(*err)) {
        c=0xffff; /* no output */
    } else if(length==0) {
        /* no input or only state changes */
        *err=U_INDEX_OUTOFBOUNDS_ERROR;
        /* no need to reset explicitly because _toUnicodeWithCallback() did it */
        c=0xffff; /* no output */
    } else {
        c=buffer[0];
        i=1;
        if(!U16_IS_LEAD(c)) {
            /* consume c=buffer[0], done */
        } else {
            /* got a lead surrogate, see if a trail surrogate follows */
            UChar c2;

            if(cnv->UCharErrorBufferLength>0) {
                /* got overflow output from the conversion */
                if(U16_IS_TRAIL(c2=cnv->UCharErrorBuffer[0])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);

                    /* move the remaining overflow contents up to the beginning */
                    if((--cnv->UCharErrorBufferLength)>0) {
                        uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+1,
                                     cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
                    }
                } else {
                    /* c is an unpaired lead surrogate, just return it */
                }
            } else if(args.source<sourceLimit) {
                /* convert once more, to buffer[1] */
                args.targetLimit=buffer+2;
                _toUnicodeWithCallback(&args, err);
                if(*err==U_BUFFER_OVERFLOW_ERROR) {
                    *err=U_ZERO_ERROR;
                }

                length=(int32_t)(args.target-buffer);
                if(U_SUCCESS(*err) && length==2 && U16_IS_TRAIL(c2=buffer[1])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    i=2;
                }
            }
        }
    }

    /*
     * move leftover output from buffer[i..length[
     * into the beginning of the overflow buffer
     */
    if(i<length) {
        /* move further overflow back */
        int32_t delta=length-i;
        if((length=cnv->UCharErrorBufferLength)>0) {
            uprv_memmove(cnv->UCharErrorBuffer+delta, cnv->UCharErrorBuffer,
                         length*U_SIZEOF_UCHAR);
        }
        cnv->UCharErrorBufferLength=(int8_t)(length+delta);

        cnv->UCharErrorBuffer[0]=buffer[i++];
        if(delta>1) {
            cnv->UCharErrorBuffer[1]=buffer[i];
        }
    }

    *source=args.source;
    return c;
}